

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

Token * __thiscall czh::lexer::Lexer::get(Token *__return_storage_ptr__,Lexer *this)

{
  Value *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Token t;
  Token TStack_c8;
  Token local_78;
  
  local_78.type = (this->buffer).type;
  this_00 = &local_78.what;
  std::__detail::__variant::
  _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)this_00,
                    (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&(this->buffer).what);
  local_78.pos.pos = (this->buffer).pos.pos;
  local_78.pos.size = (this->buffer).pos.size;
  local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->buffer).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this->buffer).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (this->buffer).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer).pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (local_78.type == UNEXPECTED) {
    get_tok(&TStack_c8,this);
    token::Token::operator=(&local_78,&TStack_c8);
    if (TStack_c8.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (TStack_c8.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::__detail::__variant::
    _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&TStack_c8.what);
    check_token(this,&local_78);
    this->is_eof = local_78.type == FEND;
  }
  get_tok(&TStack_c8,this);
  token::Token::operator=(&this->buffer,&TStack_c8);
  if (TStack_c8.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (TStack_c8.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&TStack_c8.what);
  check_token(this,&this->buffer);
  this->is_eof = (this->buffer).type == FEND;
  __return_storage_ptr__->type = local_78.type;
  std::__detail::__variant::
  _Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&__return_storage_ptr__->what,
                    (_Move_ctor_base<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)this_00);
  _Var1._M_pi = local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  (__return_storage_ptr__->pos).pos = local_78.pos.pos;
  (__return_storage_ptr__->pos).size = local_78.pos.size;
  (__return_storage_ptr__->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (__return_storage_ptr__->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->pos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  local_78.pos.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__detail::__variant::
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)this_00);
  return __return_storage_ptr__;
}

Assistant:

token::Token get()
    {
      token::Token t = std::move(buffer);
      if (t.type == token::TokenType::UNEXPECTED)
      {
        t = std::move(get_tok());
        check_token(t);
        is_eof = (t.type == token::TokenType::FEND);
      }
      buffer = std::move(get_tok());
      check_token(buffer);
      is_eof = (buffer.type == token::TokenType::FEND);
      return std::move(t);
    }